

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::erase
          (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *this,Bucket bucket)

{
  byte bVar1;
  Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *pSVar2;
  ulong uVar3;
  Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *pSVar4;
  Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *pSVar5;
  size_t bucket_00;
  Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *fromSpan;
  Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *this_00;
  size_t fromIndex;
  QStringView QVar6;
  
  bucket_00 = bucket.index;
  fromSpan = bucket.span;
  Span<QHashPrivate::Node<QString,_QList<QString>_>_>::erase
            ((Span<QHashPrivate::Node<QString,_QList<QString>_>_> *)fromSpan,bucket_00);
  *(long *)(this + 8) = *(long *)(this + 8) + -1;
  this_00 = fromSpan;
  fromIndex = bucket_00;
  do {
    pSVar2 = *(Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> **)
              (this + 0x20);
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      fromSpan = fromSpan + 1;
      if (((long)fromSpan - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 -
          (*(ulong *)(this + 0x10) >> 7) == 0) {
        fromSpan = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = fromSpan->offsets[fromIndex];
    if (bVar1 != 0xff) {
      uVar3 = (ulong)(((uint)bVar1 * 2 + (uint)bVar1) * 0x10);
      QVar6.m_data = *(storage_type_conflict **)((fromSpan->entries->storage).data + uVar3 + 8);
      QVar6.m_size = *(qsizetype *)(fromSpan->entries[1].storage.data + uVar3);
      uVar3 = qHash(QVar6,*(ulong *)(this + 0x18));
      uVar3 = *(ulong *)(this + 0x10) - 1 & uVar3;
      pSVar4 = pSVar2 + (uVar3 >> 7);
      uVar3 = (ulong)((uint)uVar3 & 0x7f);
      if (uVar3 != fromIndex || pSVar4 != fromSpan) {
        do {
          if ((pSVar4 == this_00) && (uVar3 == bucket_00)) {
            if (fromSpan == this_00) {
              this_00->offsets[bucket_00] = this_00->offsets[fromIndex];
              this_00->offsets[fromIndex] = 0xff;
              bucket_00 = fromIndex;
              this_00 = fromSpan;
            }
            else {
              Span<QHashPrivate::Node<QString,_QList<QString>_>_>::moveFromSpan
                        ((Span<QHashPrivate::Node<QString,_QList<QString>_>_> *)this_00,fromSpan,
                         fromIndex,bucket_00);
              bucket_00 = fromIndex;
              this_00 = fromSpan;
            }
            break;
          }
          uVar3 = uVar3 + 1;
          if (uVar3 == 0x80) {
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar2;
            if (((long)pSVar5 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 -
                (*(ulong *)(this + 0x10) >> 7) != 0) {
              pSVar4 = pSVar5;
            }
            uVar3 = 0;
          }
        } while ((pSVar4 != fromSpan) || (uVar3 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }